

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppleII.cpp
# Opt level: O2

void __thiscall
Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)0,_false>::Keyboard::
clear_keyboard_input(Keyboard *this)

{
  StringSerialiser *this_00;
  bool bVar1;
  
  this->keyboard_input_ = this->keyboard_input_ & 0x7f;
  this_00 = (this->string_serialiser_)._M_t.
            super___uniq_ptr_impl<Utility::StringSerialiser,_std::default_delete<Utility::StringSerialiser>_>
            ._M_t.
            super__Tuple_impl<0UL,_Utility::StringSerialiser_*,_std::default_delete<Utility::StringSerialiser>_>
            .super__Head_base<0UL,_Utility::StringSerialiser_*,_false>._M_head_impl;
  if (this_00 != (StringSerialiser *)0x0) {
    bVar1 = Utility::StringSerialiser::advance(this_00);
    if (!bVar1) {
      std::
      __uniq_ptr_impl<Utility::StringSerialiser,_std::default_delete<Utility::StringSerialiser>_>::
      reset((__uniq_ptr_impl<Utility::StringSerialiser,_std::default_delete<Utility::StringSerialiser>_>
             *)&this->string_serialiser_,(pointer)0x0);
      return;
    }
  }
  return;
}

Assistant:

void clear_keyboard_input() {
				keyboard_input_ &= 0x7f;
				if(string_serialiser_ && !string_serialiser_->advance()) {
					string_serialiser_.reset();
				}
			}